

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void quantize_ord_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                        int num_rows)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  long lVar5;
  _func_void_j_decompress_ptr *p_Var6;
  uint local_68;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int ci;
  int nc;
  int col_index;
  int row_index;
  int *dither;
  JSAMPROW colorindex_ci;
  JSAMPROW output_ptr;
  JSAMPROW input_ptr;
  my_cquantize_ptr cquantize;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JSAMPARRAY input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar4 = cinfo->cquantize;
  iVar1 = cinfo->out_color_components;
  uVar2 = cinfo->output_width;
  for (width = 0; (int)width < num_rows; width = width + 1) {
    memset(output_buf[(int)width],0,(ulong)uVar2);
    iVar3 = *(int *)((long)&pjVar4[2].color_quantize + 4);
    for (col = 0; (int)col < iVar1; col = col + 1) {
      output_ptr = input_buf[(int)width] + (int)col;
      colorindex_ci = output_buf[(int)width];
      lVar5 = *(long *)(pjVar4[1].finish_pass + (long)(int)col * 8);
      p_Var6 = (&pjVar4[2].finish_pass)[(int)col];
      ci = 0;
      for (local_68 = uVar2; local_68 != 0; local_68 = local_68 - 1) {
        *colorindex_ci =
             *colorindex_ci +
             *(char *)(lVar5 + (int)((uint)*output_ptr +
                                    *(int *)(p_Var6 + (long)ci * 4 + (long)iVar3 * 0x40)));
        output_ptr = output_ptr + iVar1;
        colorindex_ci = colorindex_ci + 1;
        ci = ci + 1U & 0xf;
      }
    }
    *(uint *)((long)&pjVar4[2].color_quantize + 4) = iVar3 + 1U & 0xf;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_ord_dither (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		     JSAMPARRAY output_buf, int num_rows)
/* General case, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  int * dither;			/* points to active row of dither matrix */
  int row_index, col_index;	/* current indexes into dither matrix */
  int nc = cinfo->out_color_components;
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    FMEMZERO((void FAR *) output_buf[row],
	     (size_t) (width * SIZEOF(JSAMPLE)));
    row_index = cquantize->row_index;
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      colorindex_ci = cquantize->colorindex[ci];
      dither = cquantize->odither[ci][row_index];
      col_index = 0;

      for (col = width; col > 0; col--) {
	/* Form pixel value + dither, range-limit to 0..MAXJSAMPLE,
	 * select output value, accumulate into output code for this pixel.
	 * Range-limiting need not be done explicitly, as we have extended
	 * the colorindex table to produce the right answers for out-of-range
	 * inputs.  The maximum dither is +- MAXJSAMPLE; this sets the
	 * required amount of padding.
	 */
	*output_ptr += colorindex_ci[GETJSAMPLE(*input_ptr)+dither[col_index]];
	input_ptr += nc;
	output_ptr++;
	col_index = (col_index + 1) & ODITHER_MASK;
      }
    }
    /* Advance row index for next row */
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}